

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::CreateProjectFile
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filename;
  string projectName;
  string outputDir;
  long *local_c8 [2];
  long local_b8 [2];
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar1 = cmLocalGenerator::GetCurrentBinaryDirectory
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_48,pcVar1,(allocator *)&local_68);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_68,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)local_c8,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)local_c8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_c8,(ulong)local_68._M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8.field_2._8_8_ = plVar2[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar4;
    local_a8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_a8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  CreateNewProjectFile(this,lgs,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  const std::string filename =
    outputDir + "/" + projectName + ".sublime-project";

  this->CreateNewProjectFile(lgs, filename);
}